

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
diligent_spirv_cross::Compiler::CombinedImageSamplerHandler::begin_function_scope
          (CombinedImageSamplerHandler *this,uint32_t *args,uint32_t length)

{
  SPIRFunction *func;
  SPIRFunction *local_28;
  
  if (2 < length) {
    func = get<diligent_spirv_cross::SPIRFunction>(this->compiler,args[2]);
    push_remap_parameters(this,func,args + 3,length - 3);
    local_28 = func;
    ::std::
    deque<diligent_spirv_cross::SPIRFunction*,std::allocator<diligent_spirv_cross::SPIRFunction*>>::
    emplace_back<diligent_spirv_cross::SPIRFunction*>
              ((deque<diligent_spirv_cross::SPIRFunction*,std::allocator<diligent_spirv_cross::SPIRFunction*>>
                *)&this->functions,&local_28);
  }
  return 2 < length;
}

Assistant:

bool Compiler::CombinedImageSamplerHandler::begin_function_scope(const uint32_t *args, uint32_t length)
{
	if (length < 3)
		return false;

	auto &callee = compiler.get<SPIRFunction>(args[2]);
	args += 3;
	length -= 3;
	push_remap_parameters(callee, args, length);
	functions.push(&callee);
	return true;
}